

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O2

void __thiscall
license::License::add_parameter(License *this,string *param_name,string *param_value)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  long lVar4;
  invalid_argument *piVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  logic_error *plVar8;
  char cVar9;
  uint day;
  uint month;
  uint year;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  License *local_1d8;
  string *local_1d0;
  allocator local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)NO_OUTPUT_PARAM_abi_cxx11_,param_name);
  if (cVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar4 = std::__cxx11::string::find((char *)param_name,0x4261e5);
    if (((lVar4 == -1) &&
        (lVar4 = std::__cxx11::string::find((char *)param_name,0x42615e), lVar4 == -1)) &&
       (lVar4 = std::__cxx11::string::find((char *)param_name,0x4268c6), lVar4 == -1)) {
      lVar4 = std::__cxx11::string::find((char *)param_name,0x452b38);
      if ((lVar4 != -1) && (bVar1 = std::operator!=(param_value,"0"), !bVar1)) {
        return;
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->values_map,param_name);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      return;
    }
    local_1d8 = this;
    local_1d0 = param_name;
    if (param_value->_M_string_length < 8) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Date string too small for known formats");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    lVar4 = 0;
    do {
      if (lVar4 + 0x20 == 0x80) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1f8,"Date [",param_value);
        std::operator+(local_1a8,&local_1f8,"] did not match a known format. try YYYY-MM-DD");
        std::invalid_argument::invalid_argument(piVar5,(string *)local_1a8);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      iVar2 = __isoc99_sscanf((param_value->_M_dataplus)._M_p,
                              *(undefined8 *)((long)&formats_abi_cxx11_ + lVar4),&year,&month,&day);
      lVar4 = lVar4 + 0x20;
    } while (iVar2 != 3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    poVar7 = std::operator<<(poVar7,"-");
    poVar7 = std::operator<<(poVar7,0x30);
    *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7,"-");
    poVar7 = std::operator<<(poVar7,0x30);
    *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_1d8->values_map,local_1d0);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  else {
    bVar1 = std::operator==("feature-names",param_name);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&this->m_feature_names);
      cVar9 = (char)&this->m_feature_names;
      lVar4 = std::__cxx11::string::find(cVar9,0x5b);
      if (((lVar4 == -1) && (lVar4 = std::__cxx11::string::find(cVar9,0x5d), lVar4 == -1)) &&
         ((lVar4 = std::__cxx11::string::find(cVar9,0x2f), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find(cVar9,0x5c), lVar4 == -1)))) {
        return;
      }
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_1f8,
                 "feature name should not contain any of \'[ ] / \' characters. Parameter feature-namesvalue :"
                 ,local_1c8);
      std::operator+(local_1a8,&local_1f8,param_name);
      std::invalid_argument::invalid_argument(piVar5,(string *)local_1a8);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar1 = std::operator==("primary-key",param_name);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_1a8,(string *)param_value);
      bVar1 = boost::filesystem::exists((path *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (!bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Primary key ");
        poVar7 = std::operator<<(poVar7,(string *)param_value);
        poVar7 = std::operator<<(poVar7," not found.");
        std::endl<char,std::char_traits<char>>(poVar7);
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1f8,"Primary key [",param_value);
        std::operator+(local_1a8,&local_1f8,"] not found");
        std::logic_error::logic_error(plVar8,(string *)local_1a8);
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::_M_assign((string *)&this->m_private_key);
    }
    else {
      bVar1 = std::operator==("output-file-name",param_name);
      if ((!bVar1) && (bVar1 = std::operator==("project-folder",param_name), !bVar1)) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,param_name," not recognized");
        std::logic_error::logic_error(plVar8,(string *)local_1a8);
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return;
}

Assistant:

void License::add_parameter(const std::string &param_name, const std::string &param_value) {
	if (NO_OUTPUT_PARAM.find(param_name) == NO_OUTPUT_PARAM.end()) {
		if (param_name.find("date") != std::string::npos || param_name.find(PARAM_EXPIRY_DATE) != std::string::npos ||
			param_name.find(PARAM_BEGIN_DATE) != std::string::npos) {
			values_map[param_name] = normalize_date(param_value);
		} else if (param_name.find("version") != std::string::npos) {
			if (param_value != "0") {
				values_map[param_name] = param_value;
			}
		} else {
			values_map[param_name] = param_value;
		}
	} else if (PARAM_FEATURE_NAMES == param_name) {
		m_feature_names = param_value;
		if (m_feature_names.find('[') != std::string::npos || m_feature_names.find(']') != std::string::npos ||
			m_feature_names.find('/') != std::string::npos || m_feature_names.find('\\') != std::string::npos) {
			throw invalid_argument(
				string("feature name should not contain any of '[ ] / \' characters. Parameter " PARAM_FEATURE_NAMES
					   "value :") +
				param_name);
		}
	} else if (PARAM_PRIMARY_KEY == param_name) {
		if (!fs::exists(param_value)) {
			cerr << "Primary key " << param_value << " not found." << endl;
			throw logic_error("Primary key [" + param_value + "] not found");
		}
		m_private_key = param_value;
	} else if (PARAM_LICENSE_OUTPUT == param_name || PARAM_PROJECT_FOLDER == param_name) {
		// just ignore
	} else {
		throw logic_error(param_name + " not recognized");
	}
}